

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateGLImpl::DvpVerifySRBResources
          (PipelineStateGLImpl *this,ShaderResourceCacheArrayType *ResourceCaches,
          BaseBindingsArrayType *BaseBindings)

{
  pointer psVar1;
  ShaderResourcesGL *this_00;
  bool bVar2;
  Uint32 UVar3;
  PipelineResourceSignatureImplType *pPVar4;
  TBindings *__one;
  GLResourceAttribs *pGVar5;
  TextureInfo *Attribs;
  ImageInfo *Attribs_00;
  char (*Args_1) [49];
  ulong uVar6;
  Uint32 ub;
  uint uVar7;
  Uint32 ShaderInd;
  PipelineStateGLImpl *local_90;
  Uint32 AllowedTypeBits;
  string msg_1;
  HandleResourceHelper HandleResource;
  char local_38 [8];
  
  local_90 = this;
  UVar3 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetResourceSignatureCount
                    (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  for (uVar6 = 0; UVar3 != uVar6; uVar6 = uVar6 + 1) {
    pPVar4 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetResourceSignature
                       (&local_90->super_PipelineStateBase<Diligent::EngineGLImplTraits>,
                        (Uint32)uVar6);
    if ((pPVar4 != (PipelineResourceSignatureImplType *)0x0) &&
       ((pPVar4->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
        .m_Desc.NumResources != 0)) {
      __one = GetBaseBindings(local_90,(Uint32)uVar6);
      bVar2 = std::operator==(__one,BaseBindings->_M_elems);
      if (!bVar2) {
        FormatString<char[124]>
                  ((string *)&HandleResource,
                   (char (*) [124])
                   "Bound resources use incorrect base binding indices. This may indicate a bug in resource signature compatibility comparison."
                  );
        DebugAssertionFailed
                  ((Char *)HandleResource.PSO,"DvpVerifySRBResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x2e9);
        std::__cxx11::string::~string((string *)&HandleResource);
      }
    }
    BaseBindings = (BaseBindingsArrayType *)((long)BaseBindings + 8);
  }
  HandleResource.shader_ind = &ShaderInd;
  ShaderInd = 0;
  HandleResource.attrib_it._M_current =
       (local_90->m_ResourceAttibutions).
       super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
       ._M_impl.super__Vector_impl_data._M_start;
  HandleResource.PSO = local_90;
  Args_1 = (char (*) [49])
           ((long)(local_90->m_ShaderResources).
                  super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_90->m_ShaderResources).
                  super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
  HandleResource.ResourceCaches = ResourceCaches;
  if (Args_1 != (char (*) [49])
                ((long)(local_90->m_ShaderNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_90->m_ShaderNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    FormatString<char[26],char[49]>
              (&msg_1,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_ShaderResources.size() == m_ShaderNames.size()",Args_1);
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"DvpVerifySRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x313);
    std::__cxx11::string::~string((string *)&msg_1);
  }
  while( true ) {
    psVar1 = (local_90->m_ShaderResources).
             super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_90->m_ShaderResources).
                      super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)ShaderInd) break;
    this_00 = psVar1[ShaderInd].
              super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    AllowedTypeBits = 0xffffffff;
    msg_1._M_dataplus._M_p = local_38;
    msg_1.field_2._M_allocated_capacity = (size_type)&AllowedTypeBits;
    msg_1._M_string_length = (size_type)this_00;
    for (uVar7 = 0; uVar7 < this_00->m_NumUniformBuffers; uVar7 = uVar7 + 1) {
      pGVar5 = &ShaderResourcesGL::GetUniformBuffer(this_00,uVar7)->super_GLResourceAttribs;
      bVar2 = ShaderResourcesGL::
              ProcessConstResources<std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>_>
              ::anon_class_24_3_16b9645b::operator()
                        ((anon_class_24_3_16b9645b *)&msg_1,pGVar5->Name);
      if (bVar2) {
        DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
        ::RESOURCE_DIMENSION_bool_(&HandleResource,pGVar5,RESOURCE_DIM_BUFFER,false);
      }
    }
    for (uVar7 = 0; uVar7 < this_00->m_NumTextures; uVar7 = uVar7 + 1) {
      Attribs = ShaderResourcesGL::GetTexture(this_00,uVar7);
      bVar2 = ShaderResourcesGL::
              ProcessConstResources<std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>_>
              ::anon_class_24_3_16b9645b::operator()
                        ((anon_class_24_3_16b9645b *)&msg_1,(Attribs->super_GLResourceAttribs).Name)
      ;
      if (bVar2) {
        DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
        ::RESOURCE_DIMENSION_bool_
                  (&HandleResource,&Attribs->super_GLResourceAttribs,Attribs->ResourceDim,
                   Attribs->IsMultisample);
      }
    }
    for (uVar7 = 0; uVar7 < this_00->m_NumImages; uVar7 = uVar7 + 1) {
      Attribs_00 = ShaderResourcesGL::GetImage(this_00,uVar7);
      bVar2 = ShaderResourcesGL::
              ProcessConstResources<std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>_>
              ::anon_class_24_3_16b9645b::operator()
                        ((anon_class_24_3_16b9645b *)&msg_1,
                         (Attribs_00->super_GLResourceAttribs).Name);
      if (bVar2) {
        DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
        ::RESOURCE_DIMENSION_bool_
                  (&HandleResource,&Attribs_00->super_GLResourceAttribs,Attribs_00->ResourceDim,
                   Attribs_00->IsMultisample);
      }
    }
    for (uVar7 = 0; uVar7 < this_00->m_NumStorageBlocks; uVar7 = uVar7 + 1) {
      pGVar5 = &ShaderResourcesGL::GetStorageBlock(this_00,uVar7)->super_GLResourceAttribs;
      bVar2 = ShaderResourcesGL::
              ProcessConstResources<std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>,_std::reference_wrapper<HandleResourceHelper>_>
              ::anon_class_24_3_16b9645b::operator()
                        ((anon_class_24_3_16b9645b *)&msg_1,pGVar5->Name);
      if (bVar2) {
        DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
        ::RESOURCE_DIMENSION_bool_(&HandleResource,pGVar5,RESOURCE_DIM_BUFFER,false);
      }
    }
    ShaderInd = ShaderInd + 1;
  }
  if (HandleResource.attrib_it._M_current !=
      (local_90->m_ResourceAttibutions).
      super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[56]>
              (&msg_1,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"HandleResource.attrib_it == m_ResourceAttibutions.end()",
               (char (*) [56])local_90);
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"DvpVerifySRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x319);
    std::__cxx11::string::~string((string *)&msg_1);
  }
  return;
}

Assistant:

void PipelineStateGLImpl::DvpVerifySRBResources(const ShaderResourceCacheArrayType& ResourceCaches,
                                                const BaseBindingsArrayType&        BaseBindings) const
{
    // Verify base bindings
    const auto SignCount = GetResourceSignatureCount();
    for (Uint32 sign = 0; sign < SignCount; ++sign)
    {
        const auto* pSignature = GetResourceSignature(sign);
        if (pSignature == nullptr || pSignature->GetTotalResourceCount() == 0)
            continue;

        DEV_CHECK_ERR(GetBaseBindings(sign) == BaseBindings[sign],
                      "Bound resources use incorrect base binding indices. This may indicate a bug in resource signature compatibility comparison.");
    }

    using AttribIter = std::vector<ResourceAttribution>::const_iterator;
    struct HandleResourceHelper
    {
        PipelineStateGLImpl const&          PSO;
        const ShaderResourceCacheArrayType& ResourceCaches;
        AttribIter                          attrib_it;
        Uint32&                             shader_ind;

        HandleResourceHelper(const PipelineStateGLImpl&          _PSO,
                             const ShaderResourceCacheArrayType& _ResourceCaches,
                             AttribIter                          _iter,
                             Uint32&                             _ind) :
            PSO{_PSO},
            ResourceCaches{_ResourceCaches},
            attrib_it{_iter},
            shader_ind{_ind}
        {}

        void Validate(const ShaderResourcesGL::GLResourceAttribs& Attribs, RESOURCE_DIMENSION ResDim, bool IsMS)
        {
            if (*attrib_it && !attrib_it->IsImmutableSampler())
            {
                const auto* pResourceCache = ResourceCaches[attrib_it->SignatureIndex];
                DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", attrib_it->SignatureIndex, " is null.");
                attrib_it->pSignature->DvpValidateCommittedResource(Attribs, ResDim, IsMS, attrib_it->ResourceIndex, *pResourceCache,
                                                                    PSO.m_ShaderNames[shader_ind].c_str(), PSO.m_Desc.Name);
            }
            ++attrib_it;
        }

        void operator()(const ShaderResourcesGL::StorageBlockInfo& Attribs) { Validate(Attribs, RESOURCE_DIM_BUFFER, false); }
        void operator()(const ShaderResourcesGL::UniformBufferInfo& Attribs) { Validate(Attribs, RESOURCE_DIM_BUFFER, false); }
        void operator()(const ShaderResourcesGL::TextureInfo& Attribs) { Validate(Attribs, Attribs.ResourceDim, Attribs.IsMultisample); }
        void operator()(const ShaderResourcesGL::ImageInfo& Attribs) { Validate(Attribs, Attribs.ResourceDim, Attribs.IsMultisample); }
    };

    Uint32               ShaderInd = 0;
    HandleResourceHelper HandleResource{*this, ResourceCaches, m_ResourceAttibutions.begin(), ShaderInd};

    VERIFY_EXPR(m_ShaderResources.size() == m_ShaderNames.size());
    for (; ShaderInd < m_ShaderResources.size(); ++ShaderInd)
    {
        m_ShaderResources[ShaderInd]->ProcessConstResources(std::ref(HandleResource), std::ref(HandleResource),
                                                            std::ref(HandleResource), std::ref(HandleResource));
    }
    VERIFY_EXPR(HandleResource.attrib_it == m_ResourceAttibutions.end());
}